

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O0

bool duckdb::TryCastDecimalCInternal<bool>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  bool result_value;
  idx_t in_stack_00000070;
  idx_t in_stack_00000078;
  bool *in_stack_00000080;
  duckdb_result *in_stack_00000088;
  undefined1 local_21;
  undefined1 local_1;
  
  bVar1 = CastDecimalCInternal<bool>
                    (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
  if (bVar1) {
    local_1 = (bool)(local_21 & 1);
  }
  else {
    local_1 = FetchDefaultValue::Operation<bool>();
  }
  return local_1;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}